

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O0

bool anon_unknown.dwarf_73e19f::TestPresetOutputTruncationHelper
               (optional<cmCTestTypes::TruncationMode> *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  TruncationMode local_bc;
  ValueHolder local_b8;
  String local_b0;
  TruncationMode local_8c;
  ValueHolder local_88;
  String local_80;
  TruncationMode local_5c;
  ValueHolder local_58;
  String local_50;
  cmJSONState *local_28;
  cmJSONState *state_local;
  Value *value_local;
  optional<cmCTestTypes::TruncationMode> *out_local;
  
  local_28 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (value == (Value *)0x0) {
    std::optional<cmCTestTypes::TruncationMode>::operator=(out);
    out_local._7_1_ = true;
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_50,(Value *)state_local);
      bVar1 = std::operator==(&local_50,"tail");
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        local_5c = Tail;
        std::optional<cmCTestTypes::TruncationMode>::optional<cmCTestTypes::TruncationMode,_true>
                  ((optional<cmCTestTypes::TruncationMode> *)&local_58,&local_5c);
        value_local->value_ = local_58;
        out_local._7_1_ = true;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_80,(Value *)state_local);
        bVar1 = std::operator==(&local_80,"middle");
        std::__cxx11::string::~string((string *)&local_80);
        if (bVar1) {
          local_8c = Middle;
          std::optional<cmCTestTypes::TruncationMode>::optional<cmCTestTypes::TruncationMode,_true>
                    ((optional<cmCTestTypes::TruncationMode> *)&local_88,&local_8c);
          value_local->value_ = local_88;
          out_local._7_1_ = true;
        }
        else {
          Json::Value::asString_abi_cxx11_(&local_b0,(Value *)state_local);
          bVar1 = std::operator==(&local_b0,"head");
          std::__cxx11::string::~string((string *)&local_b0);
          if (bVar1) {
            local_bc = Head;
            std::optional<cmCTestTypes::TruncationMode>::
            optional<cmCTestTypes::TruncationMode,_true>
                      ((optional<cmCTestTypes::TruncationMode> *)&local_b8,&local_bc);
            value_local->value_ = local_b8;
            out_local._7_1_ = true;
          }
          else {
            cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
            out_local._7_1_ = false;
          }
        }
      }
    }
    else {
      cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
      out_local._7_1_ = false;
    }
  }
  return out_local._7_1_;
}

Assistant:

bool TestPresetOutputTruncationHelper(
  cm::optional<cmCTestTypes::TruncationMode>& out, const Json::Value* value,
  cmJSONState* state)
{
  if (!value) {
    out = cm::nullopt;
    return true;
  }

  if (!value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "tail") {
    out = cmCTestTypes::TruncationMode::Tail;
    return true;
  }

  if (value->asString() == "middle") {
    out = cmCTestTypes::TruncationMode::Middle;
    return true;
  }

  if (value->asString() == "head") {
    out = cmCTestTypes::TruncationMode::Head;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}